

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOStreamBuffer.cpp
# Opt level: O0

void __thiscall
IOStreamBufferTest_creationTest_Test::~IOStreamBufferTest_creationTest_Test
          (IOStreamBufferTest_creationTest_Test *this)

{
  IOStreamBufferTest_creationTest_Test *this_local;
  
  ~IOStreamBufferTest_creationTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( IOStreamBufferTest, creationTest ) {
    bool ok( true );
    try {
        IOStreamBuffer<char> myBuffer;
    } catch ( ... ) {
        ok = false;
    }
    EXPECT_TRUE( ok );
}